

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope
          (FunctionScope *this,Function *function,Literals *arguments,ModuleRunner *parent)

{
  initializer_list<wasm::Literal> init;
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  size_type __new_size;
  char *pcVar6;
  Literal *pLVar7;
  Type *pTVar8;
  reference pvVar9;
  Name name;
  Name name_00;
  Literal *local_268;
  Literals local_148;
  undefined1 *local_110;
  Literal local_108;
  iterator local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [56];
  uintptr_t local_a8;
  uintptr_t local_a0;
  ostream *local_98;
  size_t sStack_90;
  uintptr_t local_80;
  Type local_78;
  char *local_70;
  size_t i;
  Type params;
  Type local_40 [3];
  ModuleRunner *local_28;
  ModuleRunner *parent_local;
  Literals *arguments_local;
  Function *function_local;
  FunctionScope *this_local;
  
  local_28 = parent;
  parent_local = (ModuleRunner *)arguments;
  arguments_local = (Literals *)function;
  function_local = (Function *)this;
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::vector(&this->locals);
  this->function = (Function *)arguments_local;
  this->parent = local_28;
  Name::Name(&this->currDelegateTarget);
  this->oldScope = (local_28->super_ModuleRunnerBase<wasm::ModuleRunner>).scope;
  (local_28->super_ModuleRunnerBase<wasm::ModuleRunner>).scope = this;
  (local_28->super_ModuleRunnerBase<wasm::ModuleRunner>).callDepth =
       (local_28->super_ModuleRunnerBase<wasm::ModuleRunner>).callDepth + 1;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&(local_28->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack,
             (value_type *)arguments_local);
  local_40[0] = Function::getParams((Function *)arguments_local);
  pcVar2 = (char *)Type::size(local_40);
  pcVar3 = (char *)SmallVector<wasm::Literal,_1UL>::size
                             ((SmallVector<wasm::Literal,_1UL> *)parent_local);
  if (pcVar2 != pcVar3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Function `");
    name.super_IString.str._M_str = pcVar3;
    name.super_IString.str._M_len =
         (arguments_local->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64;
    poVar4 = wasm::operator<<((wasm *)poVar4,
                              (ostream *)
                              (arguments_local->super_SmallVector<wasm::Literal,_1UL>).usedFixed,
                              name);
    poVar4 = std::operator<<(poVar4,"` expects ");
    params = Function::getParams((Function *)arguments_local);
    sVar5 = Type::size(&params);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    poVar4 = std::operator<<(poVar4," parameters, got ");
    sVar5 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)parent_local);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    poVar4 = std::operator<<(poVar4," arguments.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    ::wasm::handle_unreachable
              ("invalid param count",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xc8b);
  }
  __new_size = ::wasm::Function::getNumLocals();
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::resize(&this->locals,__new_size);
  i = (size_t)Function::getParams((Function *)arguments_local);
  local_70 = (char *)0x0;
  do {
    pcVar2 = local_70;
    pcVar6 = (char *)::wasm::Function::getNumLocals();
    pcVar3 = local_70;
    if (pcVar6 <= pcVar2) {
      return;
    }
    pcVar2 = (char *)SmallVector<wasm::Literal,_1UL>::size
                               ((SmallVector<wasm::Literal,_1UL> *)parent_local);
    if (pcVar3 < pcVar2) {
      pLVar7 = SmallVector<wasm::Literal,_1UL>::operator[]
                         ((SmallVector<wasm::Literal,_1UL> *)parent_local,(size_t)local_70);
      local_78.id = (pLVar7->type).id;
      pTVar8 = Type::operator[]((Type *)&i,(size_t)local_70);
      local_80 = pTVar8->id;
      bVar1 = ::wasm::Type::isSubType(local_78,(Type)local_80);
      if ((bVar1 & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Function `");
        local_98 = (ostream *)(arguments_local->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
        sStack_90 = (arguments_local->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].
                    field_0.i64;
        name_00.super_IString.str._M_str = pcVar2;
        name_00.super_IString.str._M_len = sStack_90;
        poVar4 = wasm::operator<<((wasm *)poVar4,local_98,name_00);
        poVar4 = std::operator<<(poVar4,"` expects type ");
        pTVar8 = Type::operator[]((Type *)&i,(size_t)local_70);
        local_a0 = pTVar8->id;
        poVar4 = (ostream *)::wasm::operator<<(poVar4,(Type)local_a0);
        poVar4 = std::operator<<(poVar4," for parameter ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)local_70);
        poVar4 = std::operator<<(poVar4,", got ");
        pLVar7 = SmallVector<wasm::Literal,_1UL>::operator[]
                           ((SmallVector<wasm::Literal,_1UL> *)parent_local,(size_t)local_70);
        local_a8 = (pLVar7->type).id;
        poVar4 = (ostream *)::wasm::operator<<(poVar4,(Type)local_a8);
        poVar4 = std::operator<<(poVar4,".");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        ::wasm::handle_unreachable
                  ("invalid param count",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xc95);
      }
      local_110 = (undefined1 *)&local_108;
      pLVar7 = SmallVector<wasm::Literal,_1UL>::operator[]
                         ((SmallVector<wasm::Literal,_1UL> *)parent_local,(size_t)local_70);
      ::wasm::Literal::Literal(&local_108,pLVar7);
      local_f0 = &local_108;
      local_e8 = 1;
      init._M_len = 1;
      init._M_array = local_f0;
      Literals::Literals((Literals *)local_e0,init);
      pvVar9 = std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::operator[]
                         (&this->locals,(size_type)local_70);
      Literals::operator=(pvVar9,(Literals *)local_e0);
      Literals::~Literals((Literals *)local_e0);
      local_268 = (Literal *)&local_f0;
      do {
        local_268 = local_268 + 0xffffffffffffffff;
        ::wasm::Literal::~Literal(local_268);
      } while (local_268 != &local_108);
    }
    else {
      bVar1 = ::wasm::Function::isVar((uint)arguments_local);
      if ((bVar1 & 1) == 0) {
        __assert_fail("function->isVar(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0xc99,
                      "wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope(Function *, const Literals &, SubType &) [SubType = wasm::ModuleRunner]"
                     );
      }
      ::wasm::Function::getLocalType((uint)arguments_local);
      ::wasm::Literal::makeZeros((Type)&local_148);
      pvVar9 = std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::operator[]
                         (&this->locals,(size_type)local_70);
      Literals::operator=(pvVar9,&local_148);
      Literals::~Literals(&local_148);
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

FunctionScope(Function* function,
                  const Literals& arguments,
                  SubType& parent)
      : function(function), parent(parent) {
      oldScope = parent.scope;
      parent.scope = this;
      parent.callDepth++;
      parent.functionStack.push_back(function->name);

      if (function->getParams().size() != arguments.size()) {
        std::cerr << "Function `" << function->name << "` expects "
                  << function->getParams().size() << " parameters, got "
                  << arguments.size() << " arguments." << std::endl;
        WASM_UNREACHABLE("invalid param count");
      }
      locals.resize(function->getNumLocals());
      Type params = function->getParams();
      for (size_t i = 0; i < function->getNumLocals(); i++) {
        if (i < arguments.size()) {
          if (!Type::isSubType(arguments[i].type, params[i])) {
            std::cerr << "Function `" << function->name << "` expects type "
                      << params[i] << " for parameter " << i << ", got "
                      << arguments[i].type << "." << std::endl;
            WASM_UNREACHABLE("invalid param count");
          }
          locals[i] = {arguments[i]};
        } else {
          assert(function->isVar(i));
          locals[i] = Literal::makeZeros(function->getLocalType(i));
        }
      }
    }